

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator
          (cmMakefileLibraryTargetGenerator *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *this_00;
  TargetType TVar1;
  pointer this_01;
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *this_02;
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> local_110;
  string local_108;
  Names local_e8;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileLibraryTargetGenerator_011c8508;
  std::__cxx11::string::string((string *)&this->FrameworkVersion);
  std::__cxx11::string::string((string *)&this->DeviceLinkObject);
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  TVar1 = cmGeneratorTarget::GetType
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar1 != INTERFACE_LIBRARY) {
    this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              (&local_108,&this->super_cmMakefileTargetGenerator);
    cmGeneratorTarget::GetLibraryNames(&local_e8,this_00,&local_108);
    cmGeneratorTarget::Names::operator=
              (&(this->super_cmMakefileTargetGenerator).TargetNames,&local_e8);
    cmGeneratorTarget::Names::~Names(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::make_unique<cmOSXBundleGenerator,cmGeneratorTarget*&>((cmGeneratorTarget **)&local_110);
  this_02 = &(this->super_cmMakefileTargetGenerator).OSXBundleGenerator;
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::operator=
            (this_02,&local_110);
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::~unique_ptr
            (&local_110);
  this_01 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
            operator->(this_02);
  cmOSXBundleGenerator::SetMacContentFolders
            (this_01,&(this->super_cmMakefileTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  if (this->GeneratorTarget->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    this->TargetNames =
      this->GeneratorTarget->GetLibraryNames(this->GetConfigName());
  }

  this->OSXBundleGenerator = cm::make_unique<cmOSXBundleGenerator>(target);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}